

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O2

int sfi::logic::getBase(string *addr)

{
  uint uVar1;
  long lVar2;
  istream *piVar3;
  ulong uVar4;
  int iVar5;
  size_type sVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  octets;
  string tmp;
  string octet;
  istringstream ss;
  
  lVar2 = std::__cxx11::string::find((char)addr,0x78);
  if (lVar2 != -1) {
    return 0x10;
  }
  octets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  octets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  octets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = 8;
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)addr,_S_in);
  octet._M_dataplus._M_p = (pointer)&octet.field_2;
  octet._M_string_length = 0;
  octet.field_2._M_local_buf[0] = '\0';
  while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&ss,(string *)&octet,'.'),
        ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&octets,&octet);
  }
  if (0x20 < (ulong)((long)octets.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)octets.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    if ((octets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 8) {
      iVar5 = 2;
    }
    else {
      iVar5 = (uint)((octets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 4) * 2 + 8;
    }
    goto LAB_001050b5;
  }
  std::__cxx11::string::string
            ((string *)&tmp,
             (string *)
             octets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  uVar1 = 0;
  for (sVar6 = 0; tmp._M_string_length != sVar6; sVar6 = sVar6 + 1) {
    if ((int)uVar1 < (int)((int)tmp._M_dataplus._M_p[sVar6] - 0x30U)) {
      uVar1 = (int)tmp._M_dataplus._M_p[sVar6] - 0x30U;
    }
  }
  if ((int)uVar1 < 2) {
    uVar4 = (octets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    if (uVar4 < 0x15) {
LAB_001050a2:
      if (uVar4 != 0xc) goto LAB_001050a8;
    }
    else {
      iVar5 = 2;
    }
  }
  else {
    if (uVar1 < 8) {
      uVar4 = (octets.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      goto LAB_001050a2;
    }
LAB_001050a8:
    iVar5 = 10;
  }
  std::__cxx11::string::~string((string *)&tmp);
LAB_001050b5:
  std::__cxx11::string::~string((string *)&octet);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&octets);
  return iVar5;
}

Assistant:

static int sfi::logic::getBase(const string& addr) {
    if (addr.find('x') != -1) {
        return 16;
    } else {

        vector<string> octets;
        istringstream ss(addr);
        string octet;
        while (getline(ss, octet, '.')) {
            octets.push_back(octet);
        }
        if (octets.size() > 1) {
//            for (const auto &o : octets) {
                if (octets[0].length() == 8)
                    return 2;
                else if (octets[0].length() == 4)
                    return 8;
                else
                    return 10;

//            }
        } else {
            int max =0 ;
            int digit;
            string tmp = octets[0];
            for (const auto& a : tmp) {
                digit = a - '0';
                if (digit > max) {
                    max = digit;
                }
            }
            if (max < 2 && octets[0].size() > 20){
                return 2;
            } else if (max < 8 && octets[0].size() == 12) {
                return 8;
            } else {
                return 10;
            }
        }
    }
}